

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O2

void __thiscall MainWindow::onResize(MainWindow *this,int w,int h,StateChange sc)

{
  if ((sc != Minimized) && ((this->window).size.h != h || (this->window).size.w != w)) {
    puts("realloc buffers");
    free_buffers(this);
    SoftwareRenderer::resize(&this->renderer,w,h);
    (this->window).size.w = w;
    (this->window).size.h = h;
    allocate_buffers(this);
  }
  std::function<void_(int,_int,_StateChange)>::operator()(&this->onAppResize,w,h,sc);
  return;
}

Assistant:

void onResize(int w, int h, StateChange sc)
	{
		//printf("resize\n");
		bool m = (w == width()) && (h == height());
		if(!m && sc != StateChange::Minimized)
		{
			printf("realloc buffers\n");
			free_buffers();
			renderer.resize(w, h);
			window.size.w = w; window.size.h = h;
			allocate_buffers();
			
		}
		onAppResize(w, h, sc);
		if(!m)
		{
			//printf("stepping and redrawing\n");
			//onAppStep();
			//window.redraw();
		}
	}